

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

int __thiscall mpt::buffer::copy(buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  buffer *pbVar1;
  uint7 extraout_var;
  buffer *from_local;
  buffer *this_local;
  
  if ((buffer *)dst == this) {
    this_local._7_1_ = 1;
    pbVar1 = this;
  }
  else {
    pbVar1 = (buffer *)
             mpt_buffer_set(this,*(undefined8 *)(dst + 8),0,dst + 0x20,*(undefined8 *)(dst + 0x18));
    if ((long)pbVar1 < 0) {
      this_local._7_1_ = 0;
    }
    else {
      pbVar1 = *(buffer **)(dst + 0x18);
      if (pbVar1 < (buffer *)this->_used) {
        trim(this,this->_used - *(long *)(dst + 0x18));
        pbVar1 = (buffer *)((ulong)extraout_var << 8);
      }
      this_local._7_1_ = 1;
    }
  }
  return (int)CONCAT71((int7)((ulong)pbVar1 >> 8),this_local._7_1_);
}

Assistant:

bool buffer::copy(const buffer &from)
{
	if (&from == this) {
		return true;
	}
	if (mpt_buffer_set(this, from._content_traits, 0, &from + 1, from._used) < 0) {
		return false;
	}
	if (from._used < _used) {
		trim(_used - from._used);
	}
	return true;
}